

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SMDLoader.cpp
# Opt level: O0

void __thiscall
Assimp::SMDImporter::ParseNodeInfo(SMDImporter *this,char *szCurrent,char **szCurrentOut)

{
  char cVar1;
  char **ppcVar2;
  bool bVar3;
  ulong uVar4;
  size_type sVar5;
  allocator local_61;
  string local_60 [32];
  char **local_40;
  char *szEnd;
  reference pvStack_30;
  bool bQuota;
  Bone *bone;
  char **ppcStack_20;
  uint iBone;
  char **szCurrentOut_local;
  char *szCurrent_local;
  SMDImporter *this_local;
  
  bone._4_4_ = 0;
  ppcStack_20 = szCurrentOut;
  szCurrentOut_local = (char **)szCurrent;
  szCurrent_local = (char *)this;
  SkipSpacesAndLineEnd(this,szCurrent,(char **)&szCurrentOut_local);
  bVar3 = ParseUnsignedInt(this,(char *)szCurrentOut_local,(char **)&szCurrentOut_local,
                           (uint *)((long)&bone + 4));
  if ((!bVar3) ||
     (bVar3 = SkipSpaces<char>((char *)szCurrentOut_local,(char **)&szCurrentOut_local), !bVar3)) {
    LogErrorNoThrow(this,"Unexpected EOF/EOL while parsing bone index");
    SkipLine(this,(char *)szCurrentOut_local,(char **)&szCurrentOut_local);
    *ppcStack_20 = (char *)szCurrentOut_local;
    return;
  }
  uVar4 = (ulong)bone._4_4_;
  sVar5 = std::vector<Assimp::SMD::Bone,_std::allocator<Assimp::SMD::Bone>_>::size(&this->asBones);
  if (sVar5 <= uVar4) {
    std::vector<Assimp::SMD::Bone,_std::allocator<Assimp::SMD::Bone>_>::resize
              (&this->asBones,(ulong)(bone._4_4_ + 1));
  }
  pvStack_30 = std::vector<Assimp::SMD::Bone,_std::allocator<Assimp::SMD::Bone>_>::operator[]
                         (&this->asBones,(ulong)bone._4_4_);
  szEnd._7_1_ = 1;
  cVar1 = *(char *)szCurrentOut_local;
  if (cVar1 == '\"') {
    szCurrentOut_local = (char **)((long)szCurrentOut_local + 1);
  }
  else {
    LogWarning(this,"Bone name is expcted to be enclosed in double quotation marks. ");
  }
  local_40 = szCurrentOut_local;
  szEnd._7_1_ = cVar1 == '\"';
  do {
    if (((szEnd._7_1_ & 1) != 0) && (*(char *)local_40 == '\"')) {
      bone._4_4_ = (int)local_40 - (int)szCurrentOut_local;
      local_40 = (char **)((long)local_40 + 1);
LAB_009e36dd:
      ppcVar2 = szCurrentOut_local;
      uVar4 = (ulong)bone._4_4_;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_60,(char *)ppcVar2,uVar4,&local_61);
      std::__cxx11::string::operator=((string *)pvStack_30,local_60);
      std::__cxx11::string::~string(local_60);
      std::allocator<char>::~allocator((allocator<char> *)&local_61);
      szCurrentOut_local = local_40;
      bVar3 = ParseSignedInt(this,(char *)local_40,(char **)&szCurrentOut_local,
                             (int *)&pvStack_30->iParent);
      if (!bVar3) {
        LogErrorNoThrow(this,"Unexpected EOF/EOL while parsing bone parent index. Assuming -1");
        SkipLine(this,(char *)szCurrentOut_local,(char **)&szCurrentOut_local);
        *ppcStack_20 = (char *)szCurrentOut_local;
        return;
      }
      SkipLine(this,(char *)szCurrentOut_local,(char **)&szCurrentOut_local);
      *ppcStack_20 = (char *)szCurrentOut_local;
      return;
    }
    if (((szEnd._7_1_ & 1) == 0) && (bVar3 = IsSpaceOrNewLine<char>(*(char *)local_40), bVar3)) {
      bone._4_4_ = (int)local_40 - (int)szCurrentOut_local;
      goto LAB_009e36dd;
    }
    if (*(char *)local_40 == '\0') {
      LogErrorNoThrow(this,"Unexpected EOF/EOL while parsing bone name");
      SkipLine(this,(char *)szCurrentOut_local,(char **)&szCurrentOut_local);
      *ppcStack_20 = (char *)szCurrentOut_local;
      return;
    }
    local_40 = (char **)((long)local_40 + 1);
  } while( true );
}

Assistant:

void SMDImporter::ParseNodeInfo(const char* szCurrent, const char** szCurrentOut) {
    unsigned int iBone  = 0;
    SkipSpacesAndLineEnd(szCurrent,&szCurrent);
    if ( !ParseUnsignedInt(szCurrent,&szCurrent,iBone) || !SkipSpaces(szCurrent,&szCurrent)) {
        LogErrorNoThrow("Unexpected EOF/EOL while parsing bone index");
        SMDI_PARSE_RETURN;
    }
    // add our bone to the list
    if (iBone >= asBones.size()) {
        asBones.resize(iBone+1);
    }
    SMD::Bone& bone = asBones[iBone];

    bool bQuota = true;
    if ('\"' != *szCurrent) {
        LogWarning("Bone name is expcted to be enclosed in "
            "double quotation marks. ");
        bQuota = false;
    } else {
        ++szCurrent;
    }

    const char* szEnd = szCurrent;
    for ( ;; ) {
        if (bQuota && '\"' == *szEnd) {
            iBone = (unsigned int)(szEnd - szCurrent);
            ++szEnd;
            break;
        } else if (!bQuota && IsSpaceOrNewLine(*szEnd)) {
            iBone = (unsigned int)(szEnd - szCurrent);
            break;
        } else if (!(*szEnd)) {
            LogErrorNoThrow("Unexpected EOF/EOL while parsing bone name");
            SMDI_PARSE_RETURN;
        }
        ++szEnd;
    }
    bone.mName = std::string(szCurrent,iBone);
    szCurrent = szEnd;

    // the only negative bone parent index that could occur is -1 AFAIK
    if(!ParseSignedInt(szCurrent,&szCurrent,(int&)bone.iParent))  {
        LogErrorNoThrow("Unexpected EOF/EOL while parsing bone parent index. Assuming -1");
        SMDI_PARSE_RETURN;
    }

    // go to the beginning of the next line
    SMDI_PARSE_RETURN;
}